

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void kj::(anonymous_namespace)::expectResImpl<kj::Array<wchar_t>,wchar_t>
               (EncodingResult<kj::Array<wchar_t>_> *result,ArrayPtr<const_wchar_t> expected,
               bool errors)

{
  wchar_t i_00;
  ulong uVar1;
  ulong uVar2;
  unsigned_long i;
  CappedArray<char,_9UL> local_60;
  CappedArray<char,_9UL> local_48;
  
  uVar1 = expected.size_;
  if ((_::Debug::minSeverity < 3 & result->hadErrors) == 1) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
               (char (*) [35])"failed: expected !result.hadErrors");
  }
  uVar2 = (result->super_Array<wchar_t>).size_;
  if ((uVar2 != uVar1) && (_::Debug::minSeverity < 3)) {
    local_60.currentSize = uVar1;
    local_48.currentSize = uVar2;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_48.currentSize,&local_60.currentSize);
    uVar2 = (result->super_Array<wchar_t>).size_;
  }
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    i_00 = (result->super_Array<wchar_t>).ptr[uVar2];
    if ((i_00 != expected.ptr[uVar2]) && (_::Debug::minSeverity < 3)) {
      i = uVar2;
      hex(&local_48,i_00);
      hex(&local_60,expected.ptr[i]);
      _::Debug::
      log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_48,&local_60)
      ;
    }
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}